

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void display_feeling(_Bool obj_only)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort uVar4;
  char *pcVar5;
  uint uVar6;
  char *fmt;
  
  bVar1 = cave->feeling;
  bVar2 = bVar1 / 10;
  if ((player->opts).opt[0x25] != true) {
    return;
  }
  if (player->depth != 0) {
    if (obj_only) {
      disturb(player);
      pcVar5 = obj_feeling_text[bVar2];
      fmt = "You feel that %s";
    }
    else {
      uVar3 = (uint)bVar2 * 0xfff6 + (uint)bVar1;
      if (z_info->feeling_need <= cave->feeling_squares) {
        uVar6 = (uint)bVar2;
        if (0x6d < bVar1) {
          uVar6 = 10;
        }
        uVar4 = 9;
        if ((uVar3 & 0xfffe) < 10) {
          uVar4 = (ushort)uVar3;
        }
        pcVar5 = ", and";
        if ((byte)uVar6 < 7 != uVar4 < 6) {
          pcVar5 = ", yet";
        }
        msg("%s%s %s",mon_feeling_text[uVar4],pcVar5,obj_feeling_text[uVar6]);
        return;
      }
      pcVar5 = mon_feeling_text[uVar3 & 0xffff];
      fmt = "%s.";
    }
    msg(fmt,pcVar5);
    return;
  }
  msg("Looks like a typical town.");
  return;
}

Assistant:

void display_feeling(bool obj_only)
{
	uint16_t obj_feeling = cave->feeling / 10;
	uint16_t mon_feeling = cave->feeling - (10 * obj_feeling);
	const char *join;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return;

	/* No useful feeling in town */
	if (!player->depth) {
		msg("Looks like a typical town.");
		return;
	}

	/* Display only the object feeling when it's first discovered. */
	if (obj_only) {
		disturb(player);
		msg("You feel that %s", obj_feeling_text[obj_feeling]);
		return;
	}

	/* Players automatically get a monster feeling. */
	if (cave->feeling_squares < z_info->feeling_need) {
		msg("%s.", mon_feeling_text[mon_feeling]);
		return;
	}

	/* Verify the feelings */
	if (obj_feeling >= N_ELEMENTS(obj_feeling_text))
		obj_feeling = N_ELEMENTS(obj_feeling_text) - 1;

	if (mon_feeling >= N_ELEMENTS(mon_feeling_text))
		mon_feeling = N_ELEMENTS(mon_feeling_text) - 1;

	/* Decide the conjunction */
	if ((mon_feeling <= 5 && obj_feeling > 6) ||
			(mon_feeling > 5 && obj_feeling <= 6))
		join = ", yet";
	else
		join = ", and";

	/* Display the feeling */
	msg("%s%s %s", mon_feeling_text[mon_feeling], join,
		obj_feeling_text[obj_feeling]);
}